

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

void If_CluMoveVar(word *pF,int nVars,int *Var2Pla,int *Pla2Var,int v,int p)

{
  int iVar1;
  word *pwVar2;
  bool bVar3;
  int iVar4;
  int Count;
  int iPlace1;
  int iPlace0;
  word *pTemp;
  word *pOut;
  word *pIn;
  word pG [1024];
  int p_local;
  int v_local;
  int *Pla2Var_local;
  int *Var2Pla_local;
  int nVars_local;
  word *pF_local;
  
  pTemp = (word *)&pIn;
  bVar3 = false;
  if ((v < 0) || (pOut = pF, nVars <= v)) {
    __assert_fail("v >= 0 && v < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x336,"void If_CluMoveVar(word *, int, int *, int *, int, int)");
  }
  while (pwVar2 = pOut, Var2Pla[v] < p) {
    iVar1 = Var2Pla[v];
    iVar4 = Var2Pla[v] + 1;
    If_CluSwapAdjacent(pTemp,pOut,iVar1,nVars);
    pOut = pTemp;
    pTemp = pwVar2;
    Var2Pla[Pla2Var[iVar1]] = Var2Pla[Pla2Var[iVar1]] + 1;
    Var2Pla[Pla2Var[iVar4]] = Var2Pla[Pla2Var[iVar4]] + -1;
    Pla2Var[iVar1] = Pla2Var[iVar4] ^ Pla2Var[iVar1];
    Pla2Var[iVar4] = Pla2Var[iVar1] ^ Pla2Var[iVar4];
    Pla2Var[iVar1] = Pla2Var[iVar4] ^ Pla2Var[iVar1];
    bVar3 = (bool)(bVar3 ^ 1);
  }
  while (p < Var2Pla[v]) {
    iVar4 = Var2Pla[v] + -1;
    iVar1 = Var2Pla[v];
    If_CluSwapAdjacent(pTemp,pOut,iVar4,nVars);
    pwVar2 = pTemp;
    pTemp = pOut;
    Var2Pla[Pla2Var[iVar4]] = Var2Pla[Pla2Var[iVar4]] + 1;
    Var2Pla[Pla2Var[iVar1]] = Var2Pla[Pla2Var[iVar1]] + -1;
    Pla2Var[iVar4] = Pla2Var[iVar1] ^ Pla2Var[iVar4];
    Pla2Var[iVar1] = Pla2Var[iVar4] ^ Pla2Var[iVar1];
    Pla2Var[iVar4] = Pla2Var[iVar1] ^ Pla2Var[iVar4];
    bVar3 = (bool)(bVar3 ^ 1);
    pOut = pwVar2;
  }
  if (bVar3) {
    If_CluCopy(pF,pOut,nVars);
  }
  if (Pla2Var[p] != v) {
    __assert_fail("Pla2Var[p] == v",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x353,"void If_CluMoveVar(word *, int, int *, int *, int, int)");
  }
  return;
}

Assistant:

void If_CluMoveVar( word * pF, int nVars, int * Var2Pla, int * Pla2Var, int v, int p )
{
    word pG[CLU_WRD_MAX], * pIn = pF, * pOut = pG, * pTemp;
    int iPlace0, iPlace1, Count = 0;
    assert( v >= 0 && v < nVars );
    while ( Var2Pla[v] < p )
    {
        iPlace0 = Var2Pla[v];
        iPlace1 = Var2Pla[v]+1;
        If_CluSwapAdjacent( pOut, pIn, iPlace0, nVars );
        pTemp = pIn; pIn = pOut, pOut = pTemp;
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Count++;
    }
    while ( Var2Pla[v] > p )
    {
        iPlace0 = Var2Pla[v]-1;
        iPlace1 = Var2Pla[v];
        If_CluSwapAdjacent( pOut, pIn, iPlace0, nVars );
        pTemp = pIn; pIn = pOut, pOut = pTemp;
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Count++;
    }
    if ( Count & 1 )
        If_CluCopy( pF, pIn, nVars );
    assert( Pla2Var[p] == v );
}